

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcasestr_s.c
# Opt level: O0

errno_t strcasestr_s(char *dest,rsize_t dmax,char *src,rsize_t slen,char **substring)

{
  long lVar1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  ulong in_RCX;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  bool bVar5;
  int i;
  rsize_t dlen;
  rsize_t len;
  errno_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_20;
  char *local_18;
  errno_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_R8 == (undefined8 *)0x0) {
    invoke_safe_str_constraint_handler
              ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
    local_c = 400;
  }
  else {
    *in_R8 = 0;
    if (in_RDI == (char *)0x0) {
      invoke_safe_str_constraint_handler
                ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
      local_c = 400;
    }
    else if (in_RSI == 0) {
      invoke_safe_str_constraint_handler
                ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
      local_c = 0x191;
    }
    else if (in_RSI < 0x10000001) {
      if (in_RDX == (char *)0x0) {
        invoke_safe_str_constraint_handler
                  ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c);
        local_c = 400;
      }
      else if (in_RCX == 0) {
        invoke_safe_str_constraint_handler
                  ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c);
        local_c = 0x191;
      }
      else if (in_RCX < 0x10000001) {
        if ((*in_RDX == '\0') || (local_20 = in_RSI, local_18 = in_RDI, in_RDI == in_RDX)) {
          *in_R8 = in_RDI;
          local_c = 0;
        }
        else {
          while( true ) {
            bVar5 = false;
            if (local_20 != 0) {
              bVar5 = *local_18 != '\0';
            }
            if (!bVar5) break;
            local_4c = 0;
            local_48 = local_20;
            local_40 = in_RCX;
            while (local_18[local_4c] != '\0' && local_48 != 0) {
              iVar3 = toupper((int)local_18[local_4c]);
              iVar4 = toupper((int)in_RDX[local_4c]);
              if (iVar3 != iVar4) break;
              bVar5 = SCARRY4(local_4c,1);
              local_4c = local_4c + 1;
              if (bVar5) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              local_40 = local_40 - 1;
              local_48 = local_48 - 1;
              if ((in_RDX[local_4c] == '\0') || (local_40 == 0)) {
                *in_R8 = local_18;
                local_c = 0;
                goto LAB_00108401;
              }
            }
            local_18 = local_18 + 1;
            local_20 = local_20 - 1;
          }
          *in_R8 = 0;
          local_c = 0x199;
        }
      }
      else {
        invoke_safe_str_constraint_handler
                  ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c);
        local_c = 0x193;
      }
    }
    else {
      invoke_safe_str_constraint_handler
                ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
      local_c = 0x193;
    }
  }
LAB_00108401:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
strcasestr_s (char *dest, rsize_t dmax,
              const char *src, rsize_t slen, char **substring)
{
    rsize_t len;
    rsize_t dlen;
    int i;

    if (substring == NULL) {
        invoke_safe_str_constraint_handler("strcasestr_s: substring is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }
    *substring = NULL;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcasestr_s: dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcasestr_s: dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcasestr_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strcasestr_s: src is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (slen == 0) {
        invoke_safe_str_constraint_handler("strcasestr_s: slen is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (slen > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcasestr_s: slen exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    /*
     * src points to a string with zero length, or
     * src equals dest, return dest
     */
    if (*src == '\0' || dest == src) {
        *substring = dest;
        return (EOK);
    }

    while (dmax && *dest) {
        i = 0;
        len = slen;
        dlen = dmax;

        while (dest[i] && dlen) {

            /* not a match, not a substring */
            if (toupper(dest[i]) != toupper(src[i])) {
                break;
            }

            /* move to the next char */
            i++;
            len--;
            dlen--;

            if (src[i] == '\0' || !len) {
                *substring = dest;
                return (EOK);
            }
        }
        dest++;
        dmax--;
    }

    /*
     * substring was not found, return NULL
     */
    *substring = NULL;
    return (ESNOTFND);
}